

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O1

JsonNull * __thiscall json::JsonArray::setNull(JsonArray *this,size_t index)

{
  pointer puVar1;
  __uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_> _Var2;
  __uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_> this_00;
  JsonNull *pJVar3;
  
  this_00._M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl =
       (tuple<json::JsonNode_*,_std::default_delete<json::JsonNode>_>)operator_new(0x10);
  JsonNull::JsonNull((JsonNull *)
                     this_00._M_t.
                     super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
                     super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl,
                     &this->super_JsonNode);
  puVar1 = (this->children).
           super__Vector_base<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>,_std::allocator<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl =
       puVar1[index]._M_t.
       super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t;
  puVar1[index]._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
  _M_t = this_00._M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>
         .super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>)
      _Var2._M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
      super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl != (JsonNode *)0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>
                          .super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl + 8))();
  }
  pJVar3 = JsonNode::operator_cast_to_JsonNull_
                     ((JsonNode *)
                      (this->children).
                      super__Vector_base<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>,_std::allocator<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[index]._M_t.
                      super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
                      _M_t);
  return pJVar3;
}

Assistant:

JsonNull &JsonArray::setNull(size_t index)
    {
        children[index] = std::unique_ptr<JsonNull>(new JsonNull(this));
        return *children[index];
    }